

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t hread2(hFILE *fp,void *destv,size_t nbytes,size_t nread)

{
  char *pcVar1;
  char *pcVar2;
  int *piVar3;
  ssize_t sVar4;
  bool bVar5;
  ssize_t ret;
  size_t n_1;
  ssize_t n;
  char *dest;
  size_t capacity;
  size_t nread_local;
  size_t nbytes_local;
  void *destv_local;
  hFILE *fp_local;
  
  pcVar1 = fp->limit;
  pcVar2 = fp->buffer;
  n = nread + (long)destv;
  nread_local = nbytes - nread;
  capacity = nread;
  while( true ) {
    bVar5 = false;
    if ((ulong)((long)pcVar1 - (long)pcVar2) <= nread_local << 1) {
      bVar5 = -1 < (char)(fp->field_0x30 << 7);
    }
    if (!bVar5) break;
    sVar4 = (*fp->backend->read)(fp,(void *)n,nread_local);
    if (sVar4 < 0) {
      piVar3 = __errno_location();
      fp->has_errno = *piVar3;
      return sVar4;
    }
    if (sVar4 == 0) {
      fp->field_0x30 = fp->field_0x30 & 0xfe | 1;
    }
    fp->offset = sVar4 + fp->offset;
    n = sVar4 + n;
    nread_local = nread_local - sVar4;
    capacity = sVar4 + capacity;
  }
  while( true ) {
    bVar5 = false;
    if (nread_local != 0) {
      bVar5 = -1 < (char)(fp->field_0x30 << 7);
    }
    if (!bVar5) break;
    sVar4 = refill_buffer(fp);
    if (sVar4 < 0) {
      return sVar4;
    }
    ret = (long)fp->end - (long)fp->begin;
    if (nread_local < (ulong)ret) {
      ret = nread_local;
    }
    memcpy((void *)n,fp->begin,ret);
    fp->begin = fp->begin + ret;
    n = ret + n;
    nread_local = nread_local - ret;
    capacity = ret + capacity;
  }
  return capacity;
}

Assistant:

ssize_t hread2(hFILE *fp, void *destv, size_t nbytes, size_t nread)
{
    const size_t capacity = fp->limit - fp->buffer;
    char *dest = (char *) destv;
    dest += nread, nbytes -= nread;

    // Read large requests directly into the destination buffer
    while (nbytes * 2 >= capacity && !fp->at_eof) {
        ssize_t n = fp->backend->read(fp, dest, nbytes);
        if (n < 0) { fp->has_errno = errno; return n; }
        else if (n == 0) fp->at_eof = 1;
        fp->offset += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    while (nbytes > 0 && !fp->at_eof) {
        size_t n;
        ssize_t ret = refill_buffer(fp);
        if (ret < 0) return ret;

        n = fp->end - fp->begin;
        if (n > nbytes) n = nbytes;
        memcpy(dest, fp->begin, n);
        fp->begin += n;
        dest += n, nbytes -= n;
        nread += n;
    }

    return nread;
}